

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

string * __thiscall
ICM::to_string<6ul>(string *__return_storage_ptr__,ICM *this,ConstDataPointer data)

{
  ICM IVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = "F";
  IVar1 = *this;
  if (IVar1 != (ICM)0x0) {
    pcVar2 = "T";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = "";
  if (IVar1 != (ICM)0x0) {
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string to_string(ConstDataPointer data) {
		using std::to_string;
		using Common::Convert::to_string;
		using TypeBase::to_string;
		return to_string(*get<_TU>((void*)data));
	}